

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O2

oonf_layer2_destination *
oonf_layer2_destination_add
          (oonf_layer2_neigh *l2neigh,netaddr *destination,oonf_layer2_origin *origin)

{
  avl_node *paVar1;
  oonf_layer2_destination *ptr;
  
  paVar1 = avl_find(&l2neigh->destinations,destination);
  if (paVar1 == (avl_node *)0x0) {
    ptr = (oonf_layer2_destination *)oonf_class_malloc(&_l2dst_class);
    if (ptr == (oonf_layer2_destination *)0x0) {
      ptr = (oonf_layer2_destination *)0x0;
    }
    else {
      *(undefined2 *)&(ptr->destination)._type = *(undefined2 *)&destination->_type;
      paVar1 = *(avl_node **)(destination->_addr + 8);
      *(avl_node **)(ptr->destination)._addr = *(avl_node **)destination->_addr;
      *(avl_node **)((long)(ptr->destination)._addr + 8) = paVar1;
      ptr->origin = origin;
      ptr->neighbor = l2neigh;
      (ptr->_node).key = ptr;
      avl_insert(&l2neigh->destinations,&ptr->_node);
      oonf_class_event(&_l2dst_class,ptr,OONF_OBJECT_ADDED);
    }
  }
  else {
    ptr = (oonf_layer2_destination *)&paVar1[-1].parent;
  }
  return ptr;
}

Assistant:

struct oonf_layer2_destination *
oonf_layer2_destination_add(
  struct oonf_layer2_neigh *l2neigh, const struct netaddr *destination, const struct oonf_layer2_origin *origin) {
  struct oonf_layer2_destination *l2dst;

  l2dst = oonf_layer2_destination_get(l2neigh, destination);
  if (l2dst) {
    return l2dst;
  }

  l2dst = oonf_class_malloc(&_l2dst_class);
  if (!l2dst) {
    return NULL;
  }

  /* copy data into destination storage */
  memcpy(&l2dst->destination, destination, sizeof(*destination));
  l2dst->origin = origin;

  /* add back-pointer */
  l2dst->neighbor = l2neigh;

  /* add to neighbor tree */
  l2dst->_node.key = &l2dst->destination;
  avl_insert(&l2neigh->destinations, &l2dst->_node);

  oonf_class_event(&_l2dst_class, l2dst, OONF_OBJECT_ADDED);
  return l2dst;
}